

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O0

string * RigidBodyDynamics::Utils::print_hierarchy_abi_cxx11_
                   (Model *model,uint body_index,int indent)

{
  _Ios_Openmode _Var1;
  const_reference pvVar2;
  const_reference pvVar3;
  size_type sVar4;
  ulong uVar5;
  const_reference pvVar6;
  ostream *poVar7;
  const_reference pvVar8;
  int in_ECX;
  value_type in_EDX;
  long in_RSI;
  string *in_RDI;
  int j_1;
  uint fbody_index;
  uint child_index;
  uint ci;
  int j;
  stringstream result;
  undefined8 in_stack_fffffffffffffc70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  Model *in_stack_fffffffffffffc78;
  allocator<char> *in_stack_fffffffffffffc80;
  char *in_stack_fffffffffffffc88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  Model *in_stack_fffffffffffffc98;
  string local_2d0 [32];
  int local_2b0;
  uint local_2ac;
  string local_2a8 [36];
  uint local_284;
  string local_280 [32];
  string local_260 [32];
  string local_240 [36];
  uint local_21c;
  string local_218 [32];
  string local_1f8 [32];
  int local_1d8;
  allocator<char> local_1c1;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [11];
  int in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a0,local_1c0,_Var1);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  for (local_1d8 = 0; local_1d8 < in_ECX; local_1d8 = local_1d8 + 1) {
    std::operator<<((ostream *)local_190,"  ");
  }
  get_body_name_abi_cxx11_
            (in_stack_fffffffffffffc78,(uint)((ulong)in_stack_fffffffffffffc70 >> 0x20));
  std::operator<<((ostream *)local_190,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  if (in_EDX != 0) {
    std::operator<<((ostream *)local_190," [ ");
  }
  do {
    pvVar2 = std::
             vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
             operator[]((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         *)(in_RSI + 0x308),(ulong)in_EDX);
    if ((pvVar2->mIsVirtual & 1U) == 0) {
LAB_0013072b:
      if (in_EDX != 0) {
        in_stack_fffffffffffffc90 = local_190;
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (in_RSI + 0xb8),(ulong)in_EDX);
        get_dof_name_abi_cxx11_(_j_1);
        poVar7 = std::operator<<((ostream *)in_stack_fffffffffffffc90,local_280);
        std::operator<<(poVar7," ]");
        std::__cxx11::string::~string(local_280);
      }
      std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
      local_284 = 0;
      while( true ) {
        uVar5 = (ulong)local_284;
        pvVar3 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)(in_RSI + 0x30),(ulong)in_EDX);
        sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar3);
        if (sVar4 <= uVar5) break;
        pbVar9 = local_190;
        pvVar3 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)(in_RSI + 0x30),(ulong)in_EDX);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  (pvVar3,(ulong)local_284);
        print_hierarchy_abi_cxx11_
                  ((Model *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffffe4,
                   in_stack_ffffffffffffffe0);
        std::operator<<((ostream *)pbVar9,local_2a8);
        std::__cxx11::string::~string(local_2a8);
        local_284 = local_284 + 1;
      }
      for (local_2ac = 0; uVar5 = (ulong)local_2ac,
          sVar4 = std::
                  vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                  ::size((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                          *)(in_RSI + 0x2e8)), uVar5 < sVar4; local_2ac = local_2ac + 1) {
        pvVar8 = std::
                 vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                               *)(in_RSI + 0x2e8),(ulong)local_2ac);
        if (pvVar8->mMovableParent == in_EDX) {
          for (local_2b0 = 0; local_2b0 < in_ECX + 1; local_2b0 = local_2b0 + 1) {
            std::operator<<((ostream *)local_190,"  ");
          }
          Model::GetBodyName_abi_cxx11_
                    (in_stack_fffffffffffffc98,(uint)((ulong)in_stack_fffffffffffffc90 >> 0x20));
          poVar7 = std::operator<<((ostream *)local_190,local_2d0);
          poVar7 = std::operator<<(poVar7," [fixed]");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_2d0);
        }
      }
      std::__cxx11::stringstream::str();
      std::__cxx11::stringstream::~stringstream(local_1a0);
      return in_RDI;
    }
    pvVar3 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)(in_RSI + 0x30),(ulong)in_EDX);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar3);
    if (sVar4 == 0) {
      std::operator<<((ostream *)local_190," end");
      goto LAB_0013072b;
    }
    pvVar3 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)(in_RSI + 0x30),(ulong)in_EDX);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar3);
    if (1 < sVar4) {
      poVar7 = (ostream *)
               std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,
                               "Error: Cannot determine multi-dof joint as massless body with id ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_EDX);
      poVar7 = std::operator<<(poVar7," (name: ");
      Model::GetBodyName_abi_cxx11_
                (in_stack_fffffffffffffc98,(uint)((ulong)in_stack_fffffffffffffc90 >> 0x20));
      poVar7 = std::operator<<(poVar7,local_218);
      poVar7 = std::operator<<(poVar7,") has more than one child:");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_218);
      local_21c = 0;
      while( true ) {
        uVar5 = (ulong)local_21c;
        pvVar3 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)(in_RSI + 0x30),(ulong)in_EDX);
        sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar3);
        if (sVar4 <= uVar5) break;
        poVar7 = std::operator<<((ostream *)&std::cerr,"  id: ");
        pvVar3 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)(in_RSI + 0x30),(ulong)in_EDX);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar3,(ulong)local_21c);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pvVar6);
        poVar7 = std::operator<<(poVar7," name: ");
        pvVar3 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)(in_RSI + 0x30),(ulong)in_EDX);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  (pvVar3,(ulong)local_21c);
        Model::GetBodyName_abi_cxx11_
                  (in_stack_fffffffffffffc98,(uint)((ulong)in_stack_fffffffffffffc90 >> 0x20));
        poVar7 = std::operator<<(poVar7,local_240);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_240);
        local_21c = local_21c + 1;
      }
      abort();
    }
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (in_RSI + 0xb8),(ulong)in_EDX);
    get_dof_name_abi_cxx11_(_j_1);
    in_stack_fffffffffffffc98 = (Model *)std::operator<<((ostream *)local_190,local_260);
    std::operator<<((ostream *)in_stack_fffffffffffffc98,", ");
    std::__cxx11::string::~string(local_260);
    pvVar3 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)(in_RSI + 0x30),(ulong)in_EDX);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar3,0);
    in_EDX = *pvVar6;
  } while( true );
}

Assistant:

std::string print_hierarchy (const RigidBodyDynamics::Model &model, unsigned int body_index = 0, int indent = 0) {
	stringstream result ("");

	for (int j = 0; j < indent; j++)
		result << "  ";

	result << get_body_name (model, body_index);

	if (body_index > 0)
		result << " [ ";

	while (model.mBodies[body_index].mIsVirtual) {
		if (model.mu[body_index].size() == 0) {
			result << " end";
			break;
		} else if (model.mu[body_index].size() > 1) {
			cerr << endl << "Error: Cannot determine multi-dof joint as massless body with id " << body_index << " (name: " << model.GetBodyName(body_index) << ") has more than one child:" << endl;
			for (unsigned int ci = 0; ci < model.mu[body_index].size(); ci++) {
				cerr << "  id: " << model.mu[body_index][ci] << " name: " << model.GetBodyName(model.mu[body_index][ci]) << endl;
			}
			abort();
		}

		result << get_dof_name(model.S[body_index]) << ", ";

		body_index = model.mu[body_index][0];
	}

	if (body_index > 0)
		result << get_dof_name(model.S[body_index]) << " ]";
	result << endl;

	unsigned int child_index = 0;
	for (child_index = 0; child_index < model.mu[body_index].size(); child_index++) {
		result << print_hierarchy (model, model.mu[body_index][child_index], indent + 1);
	}

	// print fixed children
	for (unsigned int fbody_index = 0; fbody_index < model.mFixedBodies.size(); fbody_index++) {
		if (model.mFixedBodies[fbody_index].mMovableParent == body_index) {
			for (int j = 0; j < indent + 1; j++)
				result << "  ";

			result << model.GetBodyName(model.fixed_body_discriminator + fbody_index) << " [fixed]" << endl;
		}
	}


	return result.str();
}